

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvert<float>
          (RendererImpl<short> *this,float *stereoStream,Bit32u len)

{
  short sVar1;
  short *psVar2;
  float *pfVar3;
  Bit32u len_00;
  short renderingBuffer [8192];
  short local_4038 [8196];
  
  if (len != 0) {
    do {
      len_00 = 0x1000;
      if (len < 0x1000) {
        len_00 = len;
      }
      doRender(this,local_4038,len_00);
      if (stereoStream != (float *)0x0) {
        psVar2 = local_4038;
        pfVar3 = stereoStream;
        do {
          sVar1 = *psVar2;
          psVar2 = psVar2 + 1;
          *pfVar3 = (float)(int)sVar1 * 3.0517578e-05;
          pfVar3 = pfVar3 + 1;
        } while (psVar2 < local_4038 + len_00 * 2);
      }
      stereoStream = stereoStream + len_00 * 2;
      len = len - len_00;
    } while (len != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}